

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qutil.cc
# Opt level: O3

void same_file_test(void)

{
  FILE *pFVar1;
  
  pFVar1 = (FILE *)QUtil::safe_fopen("qutil.out","r");
  fclose(pFVar1);
  pFVar1 = (FILE *)QUtil::safe_fopen("other-file","r");
  fclose(pFVar1);
  assert_same_file("qutil.out","./qutil.out",true);
  assert_same_file("qutil.out","qutil.out",true);
  assert_same_file("qutil.out","other-file",false);
  assert_same_file("qutil.out",anon_var_dwarf_49b1 + 4,false);
  assert_same_file("qutil.out",(char *)0x0,false);
  assert_same_file(anon_var_dwarf_49b1 + 4,"qutil.out",false);
  return;
}

Assistant:

void
same_file_test()
{
    try {
        fclose(QUtil::safe_fopen("qutil.out", "r"));
        fclose(QUtil::safe_fopen("other-file", "r"));
    } catch (std::exception const&) {
        std::cout << "same_file_test expects to have qutil.out and other-file"
                     " exist in the current directory\n";
        return;
    }
    assert_same_file("qutil.out", "./qutil.out", true);
    assert_same_file("qutil.out", "qutil.out", true);
    assert_same_file("qutil.out", "other-file", false);
    assert_same_file("qutil.out", "", false);
    assert_same_file("qutil.out", nullptr, false);
    assert_same_file("", "qutil.out", false);
}